

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

fio_protocol_s * protocol_try_lock(intptr_t fd,fio_protocol_lock_e type)

{
  char *pcVar1;
  char cVar2;
  fio_protocol_s *pfVar3;
  int *piVar4;
  long lVar5;
  undefined1 *puVar6;
  fio_lock_i ret;
  fio_lock_i ret_1;
  fio_lock_i ret_2;
  fio_lock_i ret_3;
  fio_lock_i ret_4;
  
  piVar4 = __errno_location();
  *piVar4 = 0;
  lVar5 = fd * 0xa8;
  LOCK();
  pcVar1 = (char *)((long)fio_data + lVar5 + 0x6c);
  cVar2 = *pcVar1;
  *pcVar1 = '\x01';
  UNLOCK();
  if (cVar2 == '\0') {
    pfVar3 = *(fio_protocol_s **)((long)fio_data + lVar5 + 0x58);
    if (pfVar3 == (fio_protocol_s *)0x0) {
      LOCK();
      *(undefined1 *)((long)fio_data + lVar5 + 0x6c) = 0;
      UNLOCK();
      *piVar4 = 9;
      return (fio_protocol_s *)0x0;
    }
    LOCK();
    pcVar1 = (char *)((long)&pfVar3->rsv + (ulong)type);
    cVar2 = *pcVar1;
    *pcVar1 = '\x01';
    UNLOCK();
    puVar6 = (undefined1 *)((long)fio_data + lVar5 + 0x6c);
    if (cVar2 == '\0') {
      LOCK();
      *puVar6 = 0;
      UNLOCK();
      return pfVar3;
    }
    LOCK();
    *puVar6 = 0;
    UNLOCK();
  }
  *piVar4 = 0xb;
  return (fio_protocol_s *)0x0;
}

Assistant:

inline static fio_protocol_s *protocol_try_lock(intptr_t fd,
                                                enum fio_protocol_lock_e type) {
  errno = 0;
  if (fio_trylock(&fd_data(fd).protocol_lock))
    goto would_block;
  fio_protocol_s *pr = fd_data(fd).protocol;
  if (!pr) {
    fio_unlock(&fd_data(fd).protocol_lock);
    goto invalid;
  }
  if (fio_trylock(&prt_meta(pr).locks[type])) {
    fio_unlock(&fd_data(fd).protocol_lock);
    goto would_block;
  }
  fio_unlock(&fd_data(fd).protocol_lock);
  return pr;
would_block:
  errno = EWOULDBLOCK;
  return NULL;
invalid:
  errno = EBADF;
  return NULL;
}